

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

void __thiscall wabt::AST::PreDecl<(wabt::ExprType)24>(AST *this,VarExpr<(wabt::ExprType)24> *ve)

{
  VarType VVar1;
  pointer pNVar2;
  size_t __n;
  pointer __s2;
  Var *pVVar3;
  int iVar4;
  pointer pNVar5;
  ExprType local_48;
  NodeType local_44;
  Var *local_40;
  void *local_38;
  
  pNVar5 = (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar2 = (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar5 != pNVar2) {
    VVar1 = (ve->var).type_;
    __n = (ve->var).field_2.name_._M_string_length;
    __s2 = (ve->var).field_2.name_._M_dataplus._M_p;
    do {
      pVVar3 = (pNVar5->u).var;
      if ((pVVar3->type_ != Name) || (VVar1 != Name)) {
        __assert_fail("is_name()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                      ,0x3e,"const std::string &wabt::Var::name() const");
      }
      if ((pVVar3->field_2).name_._M_string_length == __n) {
        if (__n == 0) {
          return;
        }
        iVar4 = bcmp((pVVar3->field_2).name_._M_dataplus._M_p,__s2,__n);
        if (iVar4 == 0) {
          return;
        }
      }
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != pNVar2);
  }
  local_44 = Decl;
  local_48 = Nop;
  local_38 = (void *)0x0;
  local_40 = &ve->var;
  std::vector<wabt::Node,std::allocator<wabt::Node>>::
  emplace_back<wabt::NodeType,wabt::ExprType,decltype(nullptr),wabt::Var_const*>
            ((vector<wabt::Node,std::allocator<wabt::Node>> *)&this->predecls,&local_44,&local_48,
             &local_38,&local_40);
  return;
}

Assistant:

void PreDecl(const VarExpr<T>& ve) {
    // FIXME: this is slow, and would be better to avoid in callers.
    // See https://github.com/WebAssembly/wabt/issues/1565
    // And https://github.com/WebAssembly/wabt/issues/1665
    for (auto& n : predecls) {
      if (n.u.var->name() == ve.var.name()) {
        return;
      }
    }
    predecls.emplace_back(NodeType::Decl, ExprType::Nop, nullptr, &ve.var);
  }